

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

StatusOr<unsigned_long>
google::protobuf::json_internal::anon_unknown_5::
ParseUInt<google::protobuf::json_internal::ParseProto2Descriptor>
          (JsonLexer *lex,Field<google::protobuf::json_internal::ParseProto2Descriptor> field)

{
  anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1 extraout_RAX;
  long in_RDX;
  anon_union_8_2_a3c22f61_for_StatusOrData<unsigned_long>_3 extraout_RDX;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  StatusOr<unsigned_long> SVar1;
  Status _status;
  StatusOr<google::protobuf::json_internal::LocationWith<unsigned_long>_> n;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<unsigned_long>_>_1
  local_50;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<unsigned_long>_>_1
  local_48;
  undefined4 local_40;
  int iStack_3c;
  undefined4 local_38 [8];
  
  ParseIntInner<unsigned_long>
            ((StatusOr<google::protobuf::json_internal::LocationWith<unsigned_long>_> *)
             &local_48.status_,(JsonLexer *)field,in_XMM0_Qa,in_XMM1_Qa);
  local_50 = local_48;
  if (((ulong)local_48 & 1) == 0) {
    LOCK();
    *(int *)local_48 = *(int *)local_48 + 1;
    UNLOCK();
  }
  if (local_48 ==
      (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<unsigned_long>_>_1
       )0x1) {
    if (((*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(byte *)(in_RDX + 2) * 4) < 9) &&
        ((0x14aU >> (*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(byte *)(in_RDX + 2) * 4
                              ) & 0x1f) & 1) != 0)) && (iStack_3c != 0)) {
      JsonLocation::Invalid((JsonLocation *)&local_50,local_38,0x14,"integer out of range");
      absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::
      StatusOrData<absl::lts_20240722::Status,_0>
                ((StatusOrData<unsigned_long> *)lex,&local_50.status_);
      if (((ulong)local_50 & 1) == 0) {
        absl::lts_20240722::status_internal::StatusRep::Unref();
      }
    }
    else {
      (lex->stream_).last_chunk_._M_len = CONCAT44(iStack_3c,local_40);
      (lex->stream_).stream_ = (ZeroCopyInputStream *)0x1;
    }
  }
  else {
    absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::
    StatusOrData<const_absl::lts_20240722::Status,_0>
              ((StatusOrData<unsigned_long> *)lex,&local_50.status_);
    absl::lts_20240722::Status::~Status(&local_50.status_);
  }
  absl::lts_20240722::internal_statusor::
  StatusOrData<google::protobuf::json_internal::LocationWith<unsigned_long>_>::~StatusOrData
            ((StatusOrData<google::protobuf::json_internal::LocationWith<unsigned_long>_> *)
             &local_48.status_);
  SVar1.super_StatusOrData<unsigned_long>.field_1.data_ = extraout_RDX.data_;
  SVar1.super_StatusOrData<unsigned_long>.field_0 = extraout_RAX;
  return (StatusOr<unsigned_long>)SVar1.super_StatusOrData<unsigned_long>;
}

Assistant:

absl::StatusOr<uint64_t> ParseUInt(JsonLexer& lex, Field<Traits> field) {
  absl::StatusOr<LocationWith<uint64_t>> n =
      ParseIntInner<uint64_t>(lex, 0, 18014398509481984.0);
  RETURN_IF_ERROR(n.status());

  if (Traits::Is32Bit(field)) {
    if (n->value > std::numeric_limits<uint32_t>::max()) {
      return n->loc.Invalid("integer out of range");
    }
  }

  return n->value;
}